

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O3

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,Path *suffix)

{
  undefined8 *puVar1;
  String *pSVar2;
  size_t sVar3;
  char *pcVar4;
  long lVar5;
  String *p;
  String *pSVar6;
  String *pSVar7;
  char *size;
  long lVar8;
  String *pSVar9;
  char *value;
  String local_48;
  
  pSVar6 = (String *)
           kj::_::HeapArrayDisposer::allocateImpl
                     (0x18,0,(suffix->parts).size_ + (this->parts).size_,(_func_void_void_ptr *)0x0,
                      (_func_void_void_ptr *)0x0);
  sVar3 = (this->parts).size_;
  pSVar9 = pSVar6;
  if (sVar3 != 0) {
    pSVar9 = (this->parts).ptr;
    lVar5 = 0;
    do {
      lVar8 = lVar5;
      pcVar4 = *(char **)((long)&(pSVar9->content).size_ + lVar8);
      value = pcVar4;
      if (pcVar4 != (char *)0x0) {
        value = *(char **)((long)&(pSVar9->content).ptr + lVar8);
      }
      size = (char *)0x0;
      if (pcVar4 != (char *)0x0) {
        size = pcVar4 + -1;
      }
      heapString(&local_48,value,(size_t)size);
      puVar1 = (undefined8 *)((long)&(pSVar6->content).ptr + lVar8);
      *puVar1 = local_48.content.ptr;
      puVar1[1] = local_48.content.size_;
      puVar1[2] = local_48.content.disposer;
      lVar5 = lVar8 + 0x18;
    } while (sVar3 * 0x18 != lVar8 + 0x18);
    pSVar9 = (String *)((long)&pSVar6[1].content.ptr + lVar8);
  }
  sVar3 = (suffix->parts).size_;
  if (sVar3 != 0) {
    pSVar7 = (suffix->parts).ptr;
    pSVar2 = pSVar7 + sVar3;
    do {
      (pSVar9->content).ptr = (pSVar7->content).ptr;
      (pSVar9->content).size_ = (pSVar7->content).size_;
      (pSVar9->content).disposer = (pSVar7->content).disposer;
      (pSVar7->content).ptr = (char *)0x0;
      (pSVar7->content).size_ = 0;
      pSVar9 = pSVar9 + 1;
      pSVar7 = pSVar7 + 1;
    } while (pSVar7 != pSVar2);
  }
  (__return_storage_ptr__->parts).ptr = pSVar6;
  (__return_storage_ptr__->parts).size_ = ((long)pSVar9 - (long)pSVar6 >> 3) * -0x5555555555555555;
  (__return_storage_ptr__->parts).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::append(Path&& suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}